

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCollapse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  char *local_70;
  char *local_60;
  char *pLogFileName;
  uint local_50;
  int c;
  int fDumpOrder;
  int fReverse;
  int fReorder;
  int fDualRail;
  int fBddSizeMax;
  int fVerbose;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_60 = (char *)0x0;
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fDualRail = 0;
  fDumpOrder = 1;
  c = 0;
  fReverse = 0;
  local_50 = 0;
  fReorder = 1000000000;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"BLrodxvh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsLogic(pAVar2);
      if ((iVar1 == 0) && (iVar1 = Abc_NtkIsStrash(pAVar2), iVar1 == 0)) {
        Abc_Print(-1,"Can only collapse a logic network or an AIG.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        pAVar2 = Abc_NtkStrash(pAVar2,0,0,0);
        _fBddSizeMax = Abc_NtkCollapse(pAVar2,fReorder,fReverse,fDumpOrder,c,local_50,fDualRail);
        Abc_NtkDelete(pAVar2);
      }
      else {
        _fBddSizeMax = Abc_NtkCollapse(pAVar2,fReorder,fReverse,fDumpOrder,c,local_50,fDualRail);
      }
      if (_fBddSizeMax == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Collapsing has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,_fBddSizeMax);
      if (local_60 != (char *)0x0) {
        pAbc->pCex = (Abc_Cex_t *)0x0;
        pAbc->nFrames = -1;
        iVar1 = Abc_NtkNodeNum(_fBddSizeMax);
        if (iVar1 == 0) {
          pAbc->Status = 1;
        }
        else {
          pAbc->Status = -1;
        }
        Abc_NtkWriteLogFile(local_60,pAbc->pCex,pAbc->Status,pAbc->nFrames,"collapse");
      }
      return 0;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_00266292;
      }
      fReorder = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fReorder < 0) {
LAB_00266292:
        Abc_Print(-2,"usage: collapse [-B <num>] [-L file] [-rodxvh]\n");
        Abc_Print(-2,"\t          collapses the network by constructing global BDDs\n");
        Abc_Print(-2,"\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n",
                  (ulong)(uint)fReorder);
        if (local_60 == (char *)0x0) {
          local_70 = "no logging";
        }
        else {
          local_70 = local_60;
        }
        Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",local_70);
        pcVar3 = "no";
        if (fDumpOrder != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-r      : toggles dynamic variable reordering [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (c != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-o      : toggles reverse variable ordering [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (fReverse != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-d      : toggles dual-rail collapsing mode [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (local_50 != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,
                  "\t-x      : toggles dumping file \"order.txt\" with variable order [default = %s]\n"
                  ,pcVar3);
        pcVar3 = "no";
        if (fDualRail != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h      : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_00266292;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_00266292;
      }
      local_60 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      break;
    case 100:
      fReverse = fReverse ^ 1;
      break;
    case 0x68:
      goto LAB_00266292;
    case 0x6f:
      c = c ^ 1;
      break;
    case 0x72:
      fDumpOrder = fDumpOrder ^ 1;
      break;
    case 0x76:
      fDualRail = fDualRail ^ 1;
      break;
    case 0x78:
      local_50 = local_50 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCollapse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fVerbose;
    int fBddSizeMax;
    int fDualRail;
    int fReorder;
    int fReverse;
    int fDumpOrder;
    int c;
    char * pLogFileName = NULL;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fVerbose = 0;
    fReorder = 1;
    fReverse = 0;
    fDualRail = 0;
    fDumpOrder = 0;
    fBddSizeMax = ABC_INFINITY;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "BLrodxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            fBddSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( fBddSizeMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            fReorder ^= 1;
            break;
        case 'o':
            fReverse ^= 1;
            break;
        case 'd':
            fDualRail ^= 1;
            break;
        case 'x':
            fDumpOrder ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only collapse a logic network or an AIG.\n" );
        return 1;
    }

    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fReverse, fDumpOrder, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fReverse, fDumpOrder, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Collapsing has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    if ( pLogFileName )
    {
        pAbc->pCex = NULL;
        pAbc->nFrames = -1;
        if ( Abc_NtkNodeNum(pNtkRes) == 0 ) 
            pAbc->Status =  1; // UNSAT
        else
            pAbc->Status = -1; // UNDEC
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "collapse" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: collapse [-B <num>] [-L file] [-rodxvh]\n" );
    Abc_Print( -2, "\t          collapses the network by constructing global BDDs\n" );
    Abc_Print( -2, "\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n", fBddSizeMax );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n",  pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r      : toggles dynamic variable reordering [default = %s]\n", fReorder? "yes": "no" );
    Abc_Print( -2, "\t-o      : toggles reverse variable ordering [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dual-rail collapsing mode [default = %s]\n", fDualRail? "yes": "no" );
    Abc_Print( -2, "\t-x      : toggles dumping file \"order.txt\" with variable order [default = %s]\n", fDumpOrder? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}